

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_cleanup.h
# Opt level: O0

void google::protobuf::internal::cleanup::
     arena_destruct_object<google::protobuf::MustBeConstructedWithOneThroughFour>(void *object)

{
  void *object_local;
  
  MustBeConstructedWithOneThroughFour::~MustBeConstructedWithOneThroughFour
            ((MustBeConstructedWithOneThroughFour *)object);
  return;
}

Assistant:

void arena_destruct_object(void* PROTOBUF_NONNULL object) {
  reinterpret_cast<T*>(object)->~T();
}